

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O2

base64_urlencode * __thiscall
cppcms::filters::base64_urlencode::operator=(base64_urlencode *this,base64_urlencode *other)

{
  base64_urlencode *pbVar1;
  
  pbVar1 = (base64_urlencode *)streamable::operator=(&this->obj_,&other->obj_);
  return pbVar1;
}

Assistant:

base64_urlencode const &base64_urlencode::operator=(base64_urlencode const &other){ obj_ = other.obj_; return *this; }